

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeTripAllCursors(Btree *pBtree,int errCode,int writeOnly)

{
  BtCursor *pCur;
  int errCode_00;
  BtCursor **ppBVar1;
  
  if (pBtree == (Btree *)0x0) {
    errCode_00 = 0;
  }
  else {
    sqlite3BtreeEnter(pBtree);
    ppBVar1 = &pBtree->pBt->pCursor;
    while (pCur = *ppBVar1, pCur != (BtCursor *)0x0) {
      if ((writeOnly == 0) || ((pCur->curFlags & 1) != 0)) {
        sqlite3BtreeClearCursor(pCur);
        pCur->eState = '\x04';
        pCur->skipNext = errCode;
      }
      else if ((pCur->eState & 0xfd) == 0) {
        errCode_00 = saveCursorPosition(pCur);
        if (errCode_00 != 0) {
          sqlite3BtreeTripAllCursors(pBtree,errCode_00,0);
          goto LAB_001301a8;
        }
      }
      btreeReleaseAllCursorPages(pCur);
      ppBVar1 = &pCur->pNext;
    }
    errCode_00 = 0;
LAB_001301a8:
    sqlite3BtreeLeave(pBtree);
  }
  return errCode_00;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeTripAllCursors(Btree *pBtree, int errCode, int writeOnly){
  BtCursor *p;
  int rc = SQLITE_OK;

  assert( (writeOnly==0 || writeOnly==1) && BTCF_WriteFlag==1 );
  if( pBtree ){
    sqlite3BtreeEnter(pBtree);
    for(p=pBtree->pBt->pCursor; p; p=p->pNext){
      if( writeOnly && (p->curFlags & BTCF_WriteFlag)==0 ){
        if( p->eState==CURSOR_VALID || p->eState==CURSOR_SKIPNEXT ){
          rc = saveCursorPosition(p);
          if( rc!=SQLITE_OK ){
            (void)sqlite3BtreeTripAllCursors(pBtree, rc, 0);
            break;
          }
        }
      }else{
        sqlite3BtreeClearCursor(p);
        p->eState = CURSOR_FAULT;
        p->skipNext = errCode;
      }
      btreeReleaseAllCursorPages(p);
    }
    sqlite3BtreeLeave(pBtree);
  }
  return rc;
}